

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_derive_keys(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_session *pmVar1;
  mbedtls_ssl_transform *pmVar2;
  byte bVar3;
  int iVar4;
  mbedtls_cipher_info_t *cipher_info_00;
  mbedtls_md_info_t *md_info_00;
  char *pcVar5;
  size_t local_208;
  size_t local_200;
  size_t local_1f0;
  size_t hash_len;
  uchar session_hash [48];
  mbedtls_ssl_handshake_params *handshake;
  mbedtls_ssl_transform *transform;
  mbedtls_ssl_session *session;
  mbedtls_md_info_t *md_info;
  mbedtls_cipher_info_t *cipher_info;
  size_t iv_copy_len;
  uchar *mac_dec;
  uchar *mac_enc;
  uchar *key2;
  uchar *key1;
  uchar keyblk [256];
  uchar tmp [64];
  int local_1c;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->session_negotiate;
  pmVar2 = ssl->transform_negotiate;
  session_hash._40_8_ = ssl->handshake;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1f6,"=> derive keys");
  cipher_info_00 = mbedtls_cipher_info_from_type(pmVar2->ciphersuite_info->cipher);
  if (cipher_info_00 == (mbedtls_cipher_info_t *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x1fc,"cipher info for %d not found",(ulong)pmVar2->ciphersuite_info->cipher);
    ssl_local._4_4_ = -0x7100;
  }
  else {
    md_info_00 = mbedtls_md_info_from_type(pmVar2->ciphersuite_info->mac);
    if (md_info_00 == (mbedtls_md_info_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x204,"mbedtls_md info for %d not found",(ulong)pmVar2->ciphersuite_info->mac);
      ssl_local._4_4_ = -0x7100;
    }
    else {
      if (ssl->minor_ver == 0) {
        *(code **)(session_hash._40_8_ + 0x610) = ssl3_prf;
        *(code **)(session_hash._40_8_ + 0x600) = ssl_calc_verify_ssl;
        *(code **)(session_hash._40_8_ + 0x608) = ssl_calc_finished_ssl;
      }
      else if (ssl->minor_ver < 3) {
        *(code **)(session_hash._40_8_ + 0x610) = tls1_prf;
        *(code **)(session_hash._40_8_ + 0x600) = ssl_calc_verify_tls;
        *(code **)(session_hash._40_8_ + 0x608) = ssl_calc_finished_tls;
      }
      else if ((ssl->minor_ver == 3) && (pmVar2->ciphersuite_info->mac == MBEDTLS_MD_SHA384)) {
        *(code **)(session_hash._40_8_ + 0x610) = tls_prf_sha384;
        *(code **)(session_hash._40_8_ + 0x600) = ssl_calc_verify_tls_sha384;
        *(code **)(session_hash._40_8_ + 0x608) = ssl_calc_finished_tls_sha384;
      }
      else {
        if (ssl->minor_ver != 3) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x233,"should never happen");
          return -0x6c00;
        }
        *(code **)(session_hash._40_8_ + 0x610) = tls_prf_sha256;
        *(code **)(session_hash._40_8_ + 0x600) = ssl_calc_verify_tls_sha256;
        *(code **)(session_hash._40_8_ + 0x608) = ssl_calc_finished_tls_sha256;
      }
      if (*(int *)(session_hash._40_8_ + 0xa84) == 0) {
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x244,"premaster secret",(uchar *)(session_hash._40_8_ + 0x660),
                   *(size_t *)(session_hash._40_8_ + 0x618));
        if (ssl->handshake->extended_ms == 1) {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x24c,"using extended master secret");
          (*ssl->handshake->calc_verify)(ssl,(uchar *)&hash_len);
          if (ssl->minor_ver == 3) {
            if (ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384) {
              local_1f0 = 0x30;
            }
            else {
              local_1f0 = 0x20;
            }
          }
          else {
            local_1f0 = 0x24;
          }
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x261,"session hash",(uchar *)&hash_len,local_1f0);
          local_1c = (**(code **)(session_hash._40_8_ + 0x610))
                               (session_hash._40_8_ + 0x660,
                                *(undefined8 *)(session_hash._40_8_ + 0x618),
                                "extended master secret",&hash_len,local_1f0,pmVar1->master,0x30);
          if (local_1c != 0) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x269,"prf",local_1c);
            return local_1c;
          }
        }
        else {
          local_1c = (**(code **)(session_hash._40_8_ + 0x610))
                               (session_hash._40_8_ + 0x660,
                                *(undefined8 *)(session_hash._40_8_ + 0x618),"master secret",
                                session_hash._40_8_ + 0x620,0x40,pmVar1->master,0x30);
        }
        if (local_1c != 0) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x276,"prf",local_1c);
          return local_1c;
        }
        mbedtls_zeroize((void *)(session_hash._40_8_ + 0x660),0x424);
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x27d,"no premaster (session resumed)");
      }
      memcpy(keyblk + 0xf8,(void *)(session_hash._40_8_ + 0x620),0x40);
      *(undefined8 *)(session_hash._40_8_ + 0x620) = tmp._24_8_;
      *(undefined8 *)(session_hash._40_8_ + 0x628) = tmp._32_8_;
      *(undefined8 *)(session_hash._40_8_ + 0x630) = tmp._40_8_;
      *(undefined8 *)(session_hash._40_8_ + 0x638) = tmp._48_8_;
      *(undefined8 *)(session_hash._40_8_ + 0x640) = keyblk._248_8_;
      *(undefined8 *)(session_hash._40_8_ + 0x648) = tmp._0_8_;
      *(undefined8 *)(session_hash._40_8_ + 0x650) = tmp._8_8_;
      *(undefined8 *)(session_hash._40_8_ + 0x658) = tmp._16_8_;
      mbedtls_zeroize(keyblk + 0xf8,0x40);
      ssl_local._4_4_ =
           (**(code **)(session_hash._40_8_ + 0x610))
                     (pmVar1->master,0x30,"key expansion",session_hash._40_8_ + 0x620,0x40,&key1,
                      0x100);
      if (ssl_local._4_4_ == 0) {
        pcVar5 = mbedtls_ssl_get_ciphersuite_name(pmVar1->ciphersuite);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x29c,"ciphersuite = %s",pcVar5);
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x29d,"master secret",pmVar1->master,0x30);
        mbedtls_debug_print_buf
                  (ssl,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x29e,"random bytes",(uchar *)(session_hash._40_8_ + 0x620),0x40);
        mbedtls_debug_print_buf
                  (ssl,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x29f,"key block",(uchar *)&key1,0x100);
        mbedtls_zeroize((void *)(session_hash._40_8_ + 0x620),0x40);
        pmVar2->keylen = cipher_info_00->key_bitlen >> 3;
        if ((cipher_info_00->mode == MBEDTLS_MODE_GCM) || (cipher_info_00->mode == MBEDTLS_MODE_CCM)
           ) {
          pmVar2->maclen = 0;
          pmVar2->ivlen = 0xc;
          pmVar2->fixed_ivlen = 4;
          iVar4 = 0x10;
          if ((pmVar2->ciphersuite_info->flags & 2) != 0) {
            iVar4 = 8;
          }
          pmVar2->minlen = (pmVar2->ivlen - pmVar2->fixed_ivlen) + (long)iVar4;
        }
        else {
          local_1c = mbedtls_md_setup(&pmVar2->md_ctx_enc,md_info_00,1);
          if ((local_1c != 0) ||
             (local_1c = mbedtls_md_setup(&pmVar2->md_ctx_dec,md_info_00,1), local_1c != 0)) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,700,"mbedtls_md_setup",local_1c);
            return local_1c;
          }
          bVar3 = mbedtls_md_get_size(md_info_00);
          pmVar2->maclen = (ulong)bVar3;
          if (pmVar1->trunc_hmac == 1) {
            pmVar2->maclen = 10;
          }
          pmVar2->ivlen = (ulong)cipher_info_00->iv_size;
          if (cipher_info_00->mode == MBEDTLS_MODE_STREAM) {
            pmVar2->minlen = pmVar2->maclen;
          }
          else {
            if (pmVar1->encrypt_then_mac == 1) {
              pmVar2->minlen = pmVar2->maclen + (ulong)cipher_info_00->block_size;
            }
            else {
              pmVar2->minlen =
                   (pmVar2->maclen + (ulong)cipher_info_00->block_size) -
                   pmVar2->maclen % (ulong)cipher_info_00->block_size;
            }
            if ((ssl->minor_ver != 0) && (ssl->minor_ver != 1)) {
              if ((ssl->minor_ver != 2) && (ssl->minor_ver != 3)) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                           ,0x2f8,"should never happen");
                return -0x6c00;
              }
              pmVar2->minlen = pmVar2->ivlen + pmVar2->minlen;
            }
          }
        }
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x300,"keylen: %d, minlen: %d, ivlen: %d, maclen: %d",(ulong)pmVar2->keylen,
                   pmVar2->minlen,pmVar2->ivlen,pmVar2->maclen);
        if ((*(uint *)&ssl->conf->field_0x164 & 1) == 0) {
          key2 = keyblk + pmVar2->maclen * 2 + -8;
          mac_enc = keyblk + (ulong)pmVar2->keylen + pmVar2->maclen * 2 + -8;
          mac_dec = (uchar *)&key1;
          iv_copy_len = (size_t)(keyblk + (pmVar2->maclen - 8));
          if (pmVar2->fixed_ivlen == 0) {
            local_200 = pmVar2->ivlen;
          }
          else {
            local_200 = pmVar2->fixed_ivlen;
          }
          memcpy(pmVar2->iv_enc,mac_enc + pmVar2->keylen,local_200);
          memcpy(pmVar2->iv_dec,mac_enc + local_200 + pmVar2->keylen,local_200);
        }
        else {
          if ((*(uint *)&ssl->conf->field_0x164 & 1) != 1) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x32e,"should never happen");
            return -0x6c00;
          }
          key2 = keyblk + (ulong)pmVar2->keylen + pmVar2->maclen * 2 + -8;
          mac_enc = keyblk + pmVar2->maclen * 2 + -8;
          mac_dec = keyblk + (pmVar2->maclen - 8);
          iv_copy_len = (size_t)&key1;
          if (pmVar2->fixed_ivlen == 0) {
            local_208 = pmVar2->ivlen;
          }
          else {
            local_208 = pmVar2->fixed_ivlen;
          }
          memcpy(pmVar2->iv_dec,key2 + pmVar2->keylen,local_208);
          memcpy(pmVar2->iv_enc,key2 + local_208 + pmVar2->keylen,local_208);
        }
        if (ssl->minor_ver == 0) {
          if (0x14 < pmVar2->maclen) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x337,"should never happen");
            return -0x6c00;
          }
          memcpy(pmVar2->mac_enc,mac_dec,pmVar2->maclen);
          memcpy(pmVar2->mac_dec,(void *)iv_copy_len,pmVar2->maclen);
        }
        else {
          if (ssl->minor_ver < 1) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x34a,"should never happen");
            return -0x6c00;
          }
          mbedtls_md_hmac_starts(&pmVar2->md_ctx_enc,mac_dec,pmVar2->maclen);
          mbedtls_md_hmac_starts(&pmVar2->md_ctx_dec,(uchar *)iv_copy_len,pmVar2->maclen);
        }
        ssl_local._4_4_ = mbedtls_cipher_setup(&pmVar2->cipher_ctx_enc,cipher_info_00);
        if (ssl_local._4_4_ == 0) {
          ssl_local._4_4_ = mbedtls_cipher_setup(&pmVar2->cipher_ctx_dec,cipher_info_00);
          if (ssl_local._4_4_ == 0) {
            ssl_local._4_4_ =
                 mbedtls_cipher_setkey
                           (&pmVar2->cipher_ctx_enc,key2,cipher_info_00->key_bitlen,MBEDTLS_ENCRYPT)
            ;
            if (ssl_local._4_4_ == 0) {
              ssl_local._4_4_ =
                   mbedtls_cipher_setkey
                             (&pmVar2->cipher_ctx_dec,mac_enc,cipher_info_00->key_bitlen,
                              MBEDTLS_DECRYPT);
              if (ssl_local._4_4_ == 0) {
                if (cipher_info_00->mode == MBEDTLS_MODE_CBC) {
                  iVar4 = mbedtls_cipher_set_padding_mode
                                    (&pmVar2->cipher_ctx_enc,MBEDTLS_PADDING_NONE);
                  if (iVar4 != 0) {
                    mbedtls_debug_print_ret
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                               ,0x385,"mbedtls_cipher_set_padding_mode",iVar4);
                    return iVar4;
                  }
                  iVar4 = mbedtls_cipher_set_padding_mode
                                    (&pmVar2->cipher_ctx_dec,MBEDTLS_PADDING_NONE);
                  if (iVar4 != 0) {
                    mbedtls_debug_print_ret
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                               ,0x38c,"mbedtls_cipher_set_padding_mode",iVar4);
                    return iVar4;
                  }
                }
                mbedtls_zeroize(&key1,0x100);
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                           ,0x3b4,"<= derive keys");
                ssl_local._4_4_ = 0;
              }
              else {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                           ,0x37b,"mbedtls_cipher_setkey",ssl_local._4_4_);
              }
            }
            else {
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                         ,0x373,"mbedtls_cipher_setkey",ssl_local._4_4_);
            }
          }
          else {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x36b,"mbedtls_cipher_setup",ssl_local._4_4_);
          }
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x364,"mbedtls_cipher_setup",ssl_local._4_4_);
        }
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x297,"prf",ssl_local._4_4_);
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_derive_keys( mbedtls_ssl_context *ssl )
{
    int ret = 0;
    unsigned char tmp[64];
    unsigned char keyblk[256];
    unsigned char *key1;
    unsigned char *key2;
    unsigned char *mac_enc;
    unsigned char *mac_dec;
    size_t iv_copy_len;
    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;

    mbedtls_ssl_session *session = ssl->session_negotiate;
    mbedtls_ssl_transform *transform = ssl->transform_negotiate;
    mbedtls_ssl_handshake_params *handshake = ssl->handshake;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> derive keys" ) );

    cipher_info = mbedtls_cipher_info_from_type( transform->ciphersuite_info->cipher );
    if( cipher_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "cipher info for %d not found",
                            transform->ciphersuite_info->cipher ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    md_info = mbedtls_md_info_from_type( transform->ciphersuite_info->mac );
    if( md_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "mbedtls_md info for %d not found",
                            transform->ciphersuite_info->mac ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /*
     * Set appropriate PRF function and other SSL / TLS / TLS1.2 functions
     */
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        handshake->tls_prf = ssl3_prf;
        handshake->calc_verify = ssl_calc_verify_ssl;
        handshake->calc_finished = ssl_calc_finished_ssl;
    }
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        handshake->tls_prf = tls1_prf;
        handshake->calc_verify = ssl_calc_verify_tls;
        handshake->calc_finished = ssl_calc_finished_tls;
    }
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA512_C)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 &&
        transform->ciphersuite_info->mac == MBEDTLS_MD_SHA384 )
    {
        handshake->tls_prf = tls_prf_sha384;
        handshake->calc_verify = ssl_calc_verify_tls_sha384;
        handshake->calc_finished = ssl_calc_finished_tls_sha384;
    }
    else
#endif
#if defined(MBEDTLS_SHA256_C)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        handshake->tls_prf = tls_prf_sha256;
        handshake->calc_verify = ssl_calc_verify_tls_sha256;
        handshake->calc_finished = ssl_calc_finished_tls_sha256;
    }
    else
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /*
     * SSLv3:
     *   master =
     *     MD5( premaster + SHA1( 'A'   + premaster + randbytes ) ) +
     *     MD5( premaster + SHA1( 'BB'  + premaster + randbytes ) ) +
     *     MD5( premaster + SHA1( 'CCC' + premaster + randbytes ) )
     *
     * TLSv1+:
     *   master = PRF( premaster, "master secret", randbytes )[0..47]
     */
    if( handshake->resume == 0 )
    {
        MBEDTLS_SSL_DEBUG_BUF( 3, "premaster secret", handshake->premaster,
                       handshake->pmslen );

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
        if( ssl->handshake->extended_ms == MBEDTLS_SSL_EXTENDED_MS_ENABLED )
        {
            unsigned char session_hash[48];
            size_t hash_len;

            MBEDTLS_SSL_DEBUG_MSG( 3, ( "using extended master secret" ) );

            ssl->handshake->calc_verify( ssl, session_hash );

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
            {
#if defined(MBEDTLS_SHA512_C)
                if( ssl->transform_negotiate->ciphersuite_info->mac ==
                    MBEDTLS_MD_SHA384 )
                {
                    hash_len = 48;
                }
                else
#endif
                    hash_len = 32;
            }
            else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
                hash_len = 36;

            MBEDTLS_SSL_DEBUG_BUF( 3, "session hash", session_hash, hash_len );

            ret = handshake->tls_prf( handshake->premaster, handshake->pmslen,
                                      "extended master secret",
                                      session_hash, hash_len,
                                      session->master, 48 );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
                return( ret );
            }

        }
        else
#endif
        ret = handshake->tls_prf( handshake->premaster, handshake->pmslen,
                                  "master secret",
                                  handshake->randbytes, 64,
                                  session->master, 48 );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
            return( ret );
        }

        mbedtls_zeroize( handshake->premaster, sizeof(handshake->premaster) );
    }
    else
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "no premaster (session resumed)" ) );

    /*
     * Swap the client and server random values.
     */
    memcpy( tmp, handshake->randbytes, 64 );
    memcpy( handshake->randbytes, tmp + 32, 32 );
    memcpy( handshake->randbytes + 32, tmp, 32 );
    mbedtls_zeroize( tmp, sizeof( tmp ) );

    /*
     *  SSLv3:
     *    key block =
     *      MD5( master + SHA1( 'A'    + master + randbytes ) ) +
     *      MD5( master + SHA1( 'BB'   + master + randbytes ) ) +
     *      MD5( master + SHA1( 'CCC'  + master + randbytes ) ) +
     *      MD5( master + SHA1( 'DDDD' + master + randbytes ) ) +
     *      ...
     *
     *  TLSv1:
     *    key block = PRF( master, "key expansion", randbytes )
     */
    ret = handshake->tls_prf( session->master, 48, "key expansion",
                              handshake->randbytes, 64, keyblk, 256 );
    if( ret != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite = %s",
                   mbedtls_ssl_get_ciphersuite_name( session->ciphersuite ) ) );
    MBEDTLS_SSL_DEBUG_BUF( 3, "master secret", session->master, 48 );
    MBEDTLS_SSL_DEBUG_BUF( 4, "random bytes", handshake->randbytes, 64 );
    MBEDTLS_SSL_DEBUG_BUF( 4, "key block", keyblk, 256 );

    mbedtls_zeroize( handshake->randbytes, sizeof( handshake->randbytes ) );

    /*
     * Determine the appropriate key, IV and MAC length.
     */

    transform->keylen = cipher_info->key_bitlen / 8;

    if( cipher_info->mode == MBEDTLS_MODE_GCM ||
        cipher_info->mode == MBEDTLS_MODE_CCM )
    {
        transform->maclen = 0;

        transform->ivlen = 12;
        transform->fixed_ivlen = 4;

        /* Minimum length is expicit IV + tag */
        transform->minlen = transform->ivlen - transform->fixed_ivlen
                            + ( transform->ciphersuite_info->flags &
                                MBEDTLS_CIPHERSUITE_SHORT_TAG ? 8 : 16 );
    }
    else
    {
        /* Initialize HMAC contexts */
        if( ( ret = mbedtls_md_setup( &transform->md_ctx_enc, md_info, 1 ) ) != 0 ||
            ( ret = mbedtls_md_setup( &transform->md_ctx_dec, md_info, 1 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
            return( ret );
        }

        /* Get MAC length */
        transform->maclen = mbedtls_md_get_size( md_info );

#if defined(MBEDTLS_SSL_TRUNCATED_HMAC)
        /*
         * If HMAC is to be truncated, we shall keep the leftmost bytes,
         * (rfc 6066 page 13 or rfc 2104 section 4),
         * so we only need to adjust the length here.
         */
        if( session->trunc_hmac == MBEDTLS_SSL_TRUNC_HMAC_ENABLED )
            transform->maclen = MBEDTLS_SSL_TRUNCATED_HMAC_LEN;
#endif /* MBEDTLS_SSL_TRUNCATED_HMAC */

        /* IV length */
        transform->ivlen = cipher_info->iv_size;

        /* Minimum length */
        if( cipher_info->mode == MBEDTLS_MODE_STREAM )
            transform->minlen = transform->maclen;
        else
        {
            /*
             * GenericBlockCipher:
             * 1. if EtM is in use: one block plus MAC
             *    otherwise: * first multiple of blocklen greater than maclen
             * 2. IV except for SSL3 and TLS 1.0
             */
#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
            if( session->encrypt_then_mac == MBEDTLS_SSL_ETM_ENABLED )
            {
                transform->minlen = transform->maclen
                                  + cipher_info->block_size;
            }
            else
#endif
            {
                transform->minlen = transform->maclen
                                  + cipher_info->block_size
                                  - transform->maclen % cipher_info->block_size;
            }

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 ||
                ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_1 )
                ; /* No need to adjust minlen */
            else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_1) || defined(MBEDTLS_SSL_PROTO_TLS1_2)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_2 ||
                ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
            {
                transform->minlen += transform->ivlen;
            }
            else
#endif
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "keylen: %d, minlen: %d, ivlen: %d, maclen: %d",
                   transform->keylen, transform->minlen, transform->ivlen,
                   transform->maclen ) );

    /*
     * Finally setup the cipher contexts, IVs and MAC secrets.
     */
#if defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
    {
        key1 = keyblk + transform->maclen * 2;
        key2 = keyblk + transform->maclen * 2 + transform->keylen;

        mac_enc = keyblk;
        mac_dec = keyblk + transform->maclen;

        /*
         * This is not used in TLS v1.1.
         */
        iv_copy_len = ( transform->fixed_ivlen ) ?
                            transform->fixed_ivlen : transform->ivlen;
        memcpy( transform->iv_enc, key2 + transform->keylen,  iv_copy_len );
        memcpy( transform->iv_dec, key2 + transform->keylen + iv_copy_len,
                iv_copy_len );
    }
    else
#endif /* MBEDTLS_SSL_CLI_C */
#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
    {
        key1 = keyblk + transform->maclen * 2 + transform->keylen;
        key2 = keyblk + transform->maclen * 2;

        mac_enc = keyblk + transform->maclen;
        mac_dec = keyblk;

        /*
         * This is not used in TLS v1.1.
         */
        iv_copy_len = ( transform->fixed_ivlen ) ?
                            transform->fixed_ivlen : transform->ivlen;
        memcpy( transform->iv_dec, key1 + transform->keylen,  iv_copy_len );
        memcpy( transform->iv_enc, key1 + transform->keylen + iv_copy_len,
                iv_copy_len );
    }
    else
#endif /* MBEDTLS_SSL_SRV_C */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( transform->maclen > sizeof transform->mac_enc )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        memcpy( transform->mac_enc, mac_enc, transform->maclen );
        memcpy( transform->mac_dec, mac_dec, transform->maclen );
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_1 )
    {
        mbedtls_md_hmac_starts( &transform->md_ctx_enc, mac_enc, transform->maclen );
        mbedtls_md_hmac_starts( &transform->md_ctx_dec, mac_dec, transform->maclen );
    }
    else
#endif
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_init != NULL )
    {
        int ret = 0;

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_init()" ) );

        if( ( ret = mbedtls_ssl_hw_record_init( ssl, key1, key2, transform->keylen,
                                        transform->iv_enc, transform->iv_dec,
                                        iv_copy_len,
                                        mac_enc, mac_dec,
                                        transform->maclen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_init", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */

    if( ( ret = mbedtls_cipher_setup( &transform->cipher_ctx_enc,
                                 cipher_info ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setup", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setup( &transform->cipher_ctx_dec,
                                 cipher_info ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setup", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setkey( &transform->cipher_ctx_enc, key1,
                               cipher_info->key_bitlen,
                               MBEDTLS_ENCRYPT ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setkey", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setkey( &transform->cipher_ctx_dec, key2,
                               cipher_info->key_bitlen,
                               MBEDTLS_DECRYPT ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setkey", ret );
        return( ret );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( cipher_info->mode == MBEDTLS_MODE_CBC )
    {
        if( ( ret = mbedtls_cipher_set_padding_mode( &transform->cipher_ctx_enc,
                                             MBEDTLS_PADDING_NONE ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_set_padding_mode", ret );
            return( ret );
        }

        if( ( ret = mbedtls_cipher_set_padding_mode( &transform->cipher_ctx_dec,
                                             MBEDTLS_PADDING_NONE ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_set_padding_mode", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    mbedtls_zeroize( keyblk, sizeof( keyblk ) );

#if defined(MBEDTLS_ZLIB_SUPPORT)
    // Initialize compression
    //
    if( session->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ssl->compress_buf == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "Allocating compression buffer" ) );
            ssl->compress_buf = mbedtls_calloc( 1, MBEDTLS_SSL_BUFFER_LEN );
            if( ssl->compress_buf == NULL )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                                    MBEDTLS_SSL_BUFFER_LEN ) );
                return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
            }
        }

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "Initializing zlib states" ) );

        memset( &transform->ctx_deflate, 0, sizeof( transform->ctx_deflate ) );
        memset( &transform->ctx_inflate, 0, sizeof( transform->ctx_inflate ) );

        if( deflateInit( &transform->ctx_deflate,
                         Z_DEFAULT_COMPRESSION )   != Z_OK ||
            inflateInit( &transform->ctx_inflate ) != Z_OK )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "Failed to initialize compression" ) );
            return( MBEDTLS_ERR_SSL_COMPRESSION_FAILED );
        }
    }
#endif /* MBEDTLS_ZLIB_SUPPORT */

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= derive keys" ) );

    return( 0 );
}